

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O2

void __thiscall
SStringView_FindChar_Test::SStringView_FindChar_Test(SStringView_FindChar_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00228ef0;
  return;
}

Assistant:

TEST (SStringView, FindChar) {
    std::string const src{"abc"};
    using sv_type = pstore::sstring_view<char const *>;
    sv_type sv = pstore::make_sstring_view (src.data (), src.length ());

    EXPECT_EQ (sv.find ('a'), 0U);
    EXPECT_EQ (sv.find ('c'), 2U);
    EXPECT_EQ (sv.find ('d'), sv_type::npos);
    EXPECT_EQ (sv.find ('c', 1U), 2U);
    EXPECT_EQ (sv.find ('c', 3U), sv_type::npos);
}